

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
PhyloTree::getFirstCommonEdge
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t1_edges,
          vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *t2_edges)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *b;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *a;
  pointer pPVar1;
  pointer pPVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  runtime_error *this;
  pointer pPVar7;
  pointer this_00;
  double dVar8;
  double dVar9;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  Bipartition local_a8;
  Bipartition local_80;
  Bipartition local_58;
  
  pPVar7 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar7 != pPVar1) {
    uVar6 = ((long)pPVar1 - (long)pPVar7 >> 3) * -0x71c71c71c71c71c7;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar7,pPVar1,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar7,pPVar1);
  }
  pPVar7 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar7 != pPVar1) {
    uVar6 = ((long)pPVar1 - (long)pPVar7 >> 3) * -0x71c71c71c71c71c7;
    lVar3 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar7,pPVar1,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<PhyloTreeEdge*,std::vector<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar7,pPVar1);
    pPVar7 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pPVar1 = (t1_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pPVar7 != pPVar1) {
      this_00 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pPVar2 = (t2_edges->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      do {
        if (this_00 == pPVar2) break;
        a = &(pPVar7->super_Bipartition).partition;
        b = &(this_00->super_Bipartition).partition;
        bVar4 = boost::operator<(a,b);
        if (bVar4) {
          bVar4 = PhyloTreeEdge::isCompatibleWith(pPVar7,t2_edges);
          if (bVar4) {
            PhyloTreeEdge::asSplit(&local_58,pPVar7);
            dVar8 = PhyloTreeEdge::getAttribute(pPVar7);
            iVar5 = PhyloTreeEdge::getOriginalID(pPVar7);
            PhyloTreeEdge::PhyloTreeEdge
                      ((PhyloTreeEdge *)__return_storage_ptr__,&local_58,dVar8,iVar5);
            local_58._vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__0013fa08;
            bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    m_check_invariants(&local_58.partition);
            local_a8.partition.m_bits.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_58.partition.m_bits.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
            goto joined_r0x00122038;
          }
          pPVar7 = pPVar7 + 1;
        }
        else {
          bVar4 = boost::operator<(b,a);
          if (!bVar4) {
            PhyloTreeEdge::asSplit(&local_80,pPVar7);
            dVar8 = PhyloTreeEdge::getLength(pPVar7);
            dVar9 = PhyloTreeEdge::getLength(this_00);
            iVar5 = PhyloTreeEdge::getOriginalID(pPVar7);
            PhyloTreeEdge::PhyloTreeEdge
                      ((PhyloTreeEdge *)__return_storage_ptr__,&local_80,dVar8 - dVar9,iVar5);
            local_80._vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__0013fa08;
            bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    m_check_invariants(&local_80.partition);
            local_a8.partition.m_bits.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_80.partition.m_bits.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
joined_r0x00122038:
            if (!bVar4) {
              __assert_fail("m_check_invariants()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kgori[P]tree_distance/src/include/boost/dynamic_bitset/dynamic_bitset.hpp"
                            ,0x279,
                            "boost::dynamic_bitset<>::~dynamic_bitset() [Block = unsigned long, Allocator = std::allocator<unsigned long>]"
                           );
            }
            if (local_a8.partition.m_bits.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_a8.partition.m_bits.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            return __return_storage_ptr__;
          }
          bVar4 = PhyloTreeEdge::isCompatibleWith(this_00,t1_edges);
          if (bVar4) {
            PhyloTreeEdge::asSplit(&local_a8,this_00);
            dVar8 = PhyloTreeEdge::getAttribute(this_00);
            iVar5 = PhyloTreeEdge::getOriginalID(this_00);
            PhyloTreeEdge::PhyloTreeEdge
                      ((PhyloTreeEdge *)__return_storage_ptr__,&local_a8,dVar8,iVar5);
            local_a8._vptr_Bipartition = (_func_int **)&PTR_toString_abi_cxx11__0013fa08;
            bVar4 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::
                    m_check_invariants(&local_a8.partition);
            goto joined_r0x00122038;
          }
          this_00 = this_00 + 1;
        }
      } while (pPVar7 != pPVar1);
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"No common edges","");
  std::runtime_error::runtime_error(this,(string *)local_c8);
  *(undefined ***)this = &PTR__runtime_error_0013fa60;
  __cxa_throw(this,&edge_not_found_exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

PhyloTreeEdge PhyloTree::getFirstCommonEdge(vector<PhyloTreeEdge> &t1_edges, vector<PhyloTreeEdge> &t2_edges) {
    std::sort(t1_edges.begin(), t1_edges.end());
    std::sort(t2_edges.begin(), t2_edges.end());

    auto first1 = t1_edges.begin();
    auto first2 = t2_edges.begin();
    auto last1 = t1_edges.end();
    auto last2 = t2_edges.end();

    while (first1 != last1 && first2 != last2) {
        if (*first1 < *first2) {
            if (first1->isCompatibleWith(t2_edges)) {
                return PhyloTreeEdge(first1->asSplit(), first1->getAttribute(), first1->getOriginalID());
            }
            ++first1; // first1 not in list2
        } else {
            if (!(*first2 < *first1)) { // first1 == first2
                return PhyloTreeEdge(first1->asSplit(), first1->getLength() - first2->getLength(), first1->getOriginalID());
            }
            else { // first2 not in list1
                if (first2->isCompatibleWith(t1_edges)) {
                    return PhyloTreeEdge(first2->asSplit(), first2->getAttribute(), first2->getOriginalID());
                }
            }
            ++first2;
        }
    }
    throw edge_not_found_exception("No common edges");
}